

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O2

int readbtable(fitsfile *fptr,int *status)

{
  int *status_00;
  int *piVar1;
  fitsfile *fptr_00;
  int iVar2;
  long nelem;
  long lVar3;
  long lVar4;
  int anynull;
  int *local_58;
  fitsfile *local_50;
  long nrows;
  float elapcpu;
  int hdutype;
  double elapse;
  
  iVar2 = ffmrhd(fptr,1,&hdutype,status);
  if (iVar2 == 0) {
    local_50 = fptr;
    ffgrsz(fptr,&nrows,status);
    lVar4 = 20000;
    if (nrows < 20000) {
      lVar4 = nrows;
    }
    nrows = lVar4;
    printf("Read back BINTABLE                              ");
    local_58 = status;
    marktime(status);
    fptr_00 = local_50;
    status_00 = local_58;
    lVar4 = 1;
    for (lVar3 = 2500000; piVar1 = local_58, lVar3 != 0; lVar3 = lVar3 - nelem) {
      nelem = nrows;
      if (lVar3 <= nrows) {
        nelem = lVar3;
      }
      ffgcvj(fptr_00,1,lVar4,1,nelem,0,sarray,&anynull,status_00);
      ffgcvj(fptr_00,2,lVar4,1,nelem,0,sarray,&anynull,status_00);
      lVar4 = lVar4 + nelem;
    }
    gettime(&elapse,&elapcpu,local_58);
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4034000000000000,elapse,
           (double)(float)(((double)elapcpu / elapse) * 100.0),(double)(float)(20.0 / elapse));
    return *piVar1;
  }
  printerror(*status);
}

Assistant:

int readbtable( fitsfile *fptr, int *status )

    /************************************************************/
    /* read and print data values from the binary table */
    /************************************************************/
{
    int hdutype, anynull;
    long nremain, ntodo, firstrow = 1, firstelem = 1;
    long nrows;
    long lnull = 0;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* move to the table */
    if ( fits_movrel_hdu(fptr, 1, &hdutype, status) ) 
           printerror( *status );

    /* get table row size and optimum number of rows to read per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    
    /*  read the columns */  
    nremain = BROWS;

    printf("Read back BINTABLE                              ");
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffgcvj(fptr, 1, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      ffgcvj(fptr, 2, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      firstrow += ntodo; 
      nremain  -= ntodo;
    }

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = BROWS * 8. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}